

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DataTypeClamp(ImGuiDataType data_type,void *p_data,void *p_min,void *p_max)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  
  switch(data_type) {
  case 0:
    if (((p_min == (void *)0x0) || (bVar1 = *p_min, (char)bVar1 <= *p_data)) &&
       ((p_max == (void *)0x0 || (bVar1 = *p_max, *p_data <= (char)bVar1)))) {
      return false;
    }
    break;
  case 1:
    if ((p_min == (void *)0x0) || (bVar1 = *p_min, bVar1 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      bVar1 = *p_max;
      if (*p_data <= bVar1) {
        return false;
      }
    }
    break;
  case 2:
    if ((p_min == (void *)0x0) || (uVar2 = *p_min, (short)uVar2 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      uVar2 = *p_max;
      if (*p_data <= (short)uVar2) {
        return false;
      }
    }
    goto LAB_0016e38d;
  case 3:
    if ((p_min == (void *)0x0) || (uVar2 = *p_min, uVar2 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      uVar2 = *p_max;
      if (*p_data <= uVar2) {
        return false;
      }
    }
LAB_0016e38d:
    *(ushort *)p_data = uVar2;
    return true;
  case 4:
    if ((p_min == (void *)0x0) || (uVar3 = *p_min, (int)uVar3 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      uVar3 = *p_max;
      if (*p_data <= (int)uVar3) {
        return false;
      }
    }
    goto LAB_0016e3e5;
  case 5:
    if ((p_min == (void *)0x0) || (uVar3 = *p_min, uVar3 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      uVar3 = *p_max;
      if (*p_data <= uVar3) {
        return false;
      }
    }
LAB_0016e3e5:
    *(uint *)p_data = uVar3;
    return true;
  case 6:
    if ((p_min == (void *)0x0) || (uVar4 = *p_min, (long)uVar4 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      uVar4 = *p_max;
      if (*p_data <= (long)uVar4) {
        return false;
      }
    }
    goto LAB_0016e403;
  case 7:
    if ((p_min == (void *)0x0) || (uVar4 = *p_min, uVar4 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      uVar4 = *p_max;
      if (*p_data <= uVar4) {
        return false;
      }
    }
LAB_0016e403:
    *(ulong *)p_data = uVar4;
    return true;
  case 8:
    if ((p_min == (void *)0x0) || (fVar5 = *p_min, fVar5 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      fVar5 = *p_max;
      if (*p_data <= fVar5) {
        return false;
      }
    }
    *(float *)p_data = fVar5;
    return true;
  case 9:
    if ((p_min == (void *)0x0) || (dVar6 = *p_min, dVar6 <= *p_data)) {
      if (p_max == (void *)0x0) {
        return false;
      }
      dVar6 = *p_max;
      if (*p_data <= dVar6) {
        return false;
      }
    }
    *(double *)p_data = dVar6;
    return true;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x807,
                  "bool ImGui::DataTypeClamp(ImGuiDataType, void *, const void *, const void *)");
  }
  *(byte *)p_data = bVar1;
  return true;
}

Assistant:

bool ImGui::DataTypeClamp(ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return DataTypeClampT<ImS8  >((ImS8*  )p_data, (const ImS8*  )p_min, (const ImS8*  )p_max);
    case ImGuiDataType_U8:     return DataTypeClampT<ImU8  >((ImU8*  )p_data, (const ImU8*  )p_min, (const ImU8*  )p_max);
    case ImGuiDataType_S16:    return DataTypeClampT<ImS16 >((ImS16* )p_data, (const ImS16* )p_min, (const ImS16* )p_max);
    case ImGuiDataType_U16:    return DataTypeClampT<ImU16 >((ImU16* )p_data, (const ImU16* )p_min, (const ImU16* )p_max);
    case ImGuiDataType_S32:    return DataTypeClampT<ImS32 >((ImS32* )p_data, (const ImS32* )p_min, (const ImS32* )p_max);
    case ImGuiDataType_U32:    return DataTypeClampT<ImU32 >((ImU32* )p_data, (const ImU32* )p_min, (const ImU32* )p_max);
    case ImGuiDataType_S64:    return DataTypeClampT<ImS64 >((ImS64* )p_data, (const ImS64* )p_min, (const ImS64* )p_max);
    case ImGuiDataType_U64:    return DataTypeClampT<ImU64 >((ImU64* )p_data, (const ImU64* )p_min, (const ImU64* )p_max);
    case ImGuiDataType_Float:  return DataTypeClampT<float >((float* )p_data, (const float* )p_min, (const float* )p_max);
    case ImGuiDataType_Double: return DataTypeClampT<double>((double*)p_data, (const double*)p_min, (const double*)p_max);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}